

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_block::run_impl(statement_block *this)

{
  context_t *c;
  _Elt_pointer ppsVar1;
  element_type *peVar2;
  _Elt_pointer ppsVar3;
  _Elt_pointer ppsVar4;
  _Map_pointer pppsVar5;
  scope_guard scope;
  scope_guard local_98 [13];
  
  c = &(this->super_statement_base).context;
  scope_guard::scope_guard(local_98,c);
  ppsVar3 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar5 = (this->mBlock).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar3 != ppsVar1) {
    statement_base::run(*ppsVar3);
    peVar2 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((peVar2->return_fcall != false) || (peVar2->break_block != false)) ||
       (peVar2->continue_block != false)) break;
    ppsVar3 = ppsVar3 + 1;
    if (ppsVar3 == ppsVar4) {
      ppsVar3 = pppsVar5[1];
      pppsVar5 = pppsVar5 + 1;
      ppsVar4 = ppsVar3 + 0x40;
    }
  }
  scope_guard::~scope_guard(local_98);
  return;
}

Assistant:

void statement_block::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		scope_guard scope(context);
		for (auto &ptr: mBlock) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (context->instance->return_fcall || context->instance->break_block || context->instance->continue_block)
				break;
		}
	}